

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,ArrayPtr<const_char> input,Builder output)

{
  Builder output_00;
  Reader input_00;
  Builder json;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>(&json,&message.super_MessageBuilder);
  output_00._builder.capTable = json._builder.capTable;
  output_00._builder.segment = json._builder.segment;
  output_00._builder.data = json._builder.data;
  output_00._builder.pointers = json._builder.pointers;
  output_00._builder.dataSize = json._builder.dataSize;
  output_00._builder.pointerCount = json._builder.pointerCount;
  output_00._builder._38_2_ = json._builder._38_2_;
  decodeRaw(this,input,output_00);
  capnp::_::StructBuilder::asReader(&json._builder);
  input_00._reader.capTable = (CapTableReader *)uStack_138;
  input_00._reader.segment = (SegmentReader *)local_140;
  input_00._reader.data = (void *)local_130;
  input_00._reader.pointers = (WirePointer *)uStack_128;
  input_00._reader._32_8_ = local_120;
  input_00._reader._40_8_ = uStack_118;
  decode(this,input_00,output);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

void JsonCodec::decode(kj::ArrayPtr<const char> input, DynamicStruct::Builder output) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  decode(json, output);
}